

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op)

{
  bool bVar1;
  char (*ts_7) [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = should_forward(this,op0);
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    if (bVar1) {
      bVar1 = should_forward(this,op2);
      goto LAB_001f13d7;
    }
  }
  bVar1 = false;
LAB_001f13d7:
  to_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
  to_unpacked_expression_abi_cxx11_(&local_b0,this,op1,true);
  ts_7 = (char (*) [2])0x1f1419;
  to_unpacked_expression_abi_cxx11_(&local_50,this,op2,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_70,(spirv_cross *)&op,(char **)0x35c56f,(char (*) [2])&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c44c,
             (char (*) [3])&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c44c,
             (char (*) [3])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,ts_7);
  emit_op(this,result_type,result_id,&local_70,bVar1,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                        uint32_t op2, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2);
	emit_op(result_type, result_id,
	        join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ", ",
	             to_unpacked_expression(op2), ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}